

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O0

void ucm_moveMappings(UCMTable *base,UCMTable *ext)

{
  byte bVar1;
  anon_union_4_2_095b93d3_for_b aVar2;
  int8_t iVar3;
  int8_t iVar4;
  int8_t iVar5;
  anon_union_4_2_095b93d3_for_b *local_58;
  UCMapping *local_48;
  UCMapping *pUStack_28;
  int8_t flag;
  UCMapping *mbLimit;
  UCMapping *mb;
  UCMTable *ext_local;
  UCMTable *base_local;
  
  mbLimit = base->mappings;
  pUStack_28 = mbLimit + base->mappingsLength;
  while (mbLimit < pUStack_28) {
    bVar1 = mbLimit->moveFlag;
    if (bVar1 == 0) {
      mbLimit = mbLimit + 1;
    }
    else {
      mbLimit->moveFlag = '\0';
      if ((ext != (UCMTable *)0x0) && ((bVar1 & 1) != 0)) {
        if (mbLimit->uLen == '\x01') {
          local_48 = mbLimit;
        }
        else {
          local_48 = (UCMapping *)(base->codePoints + mbLimit->u);
        }
        if (mbLimit->bLen < '\x05') {
          local_58 = &mbLimit->b;
        }
        else {
          local_58 = (anon_union_4_2_095b93d3_for_b *)(base->bytes + (mbLimit->b).idx);
        }
        ucm_addMapping(ext,mbLimit,&local_48->u,local_58->bytes);
      }
      if (mbLimit < pUStack_28 + -1) {
        aVar2 = pUStack_28[-1].b;
        mbLimit->u = pUStack_28[-1].u;
        mbLimit->b = aVar2;
        iVar3 = pUStack_28[-1].bLen;
        iVar4 = pUStack_28[-1].f;
        iVar5 = pUStack_28[-1].moveFlag;
        mbLimit->uLen = pUStack_28[-1].uLen;
        mbLimit->bLen = iVar3;
        mbLimit->f = iVar4;
        mbLimit->moveFlag = iVar5;
      }
      pUStack_28 = pUStack_28 + -1;
      base->mappingsLength = base->mappingsLength + -1;
      base->isSorted = '\0';
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucm_moveMappings(UCMTable *base, UCMTable *ext) {
    UCMapping *mb, *mbLimit;
    int8_t flag;

    mb=base->mappings;
    mbLimit=mb+base->mappingsLength;

    while(mb<mbLimit) {
        flag=mb->moveFlag;
        if(flag!=0) {
            /* reset the move flag */
            mb->moveFlag=0;

            if(ext!=NULL && (flag&UCM_MOVE_TO_EXT)) {
                /* add the mapping to the extension table */
                ucm_addMapping(ext, mb, UCM_GET_CODE_POINTS(base, mb), UCM_GET_BYTES(base, mb));
            }

            /* remove this mapping: move the last base mapping down and overwrite the current one */
            if(mb<(mbLimit-1)) {
                uprv_memcpy(mb, mbLimit-1, sizeof(UCMapping));
            }
            --mbLimit;
            --base->mappingsLength;
            base->isSorted=FALSE;
        } else {
            ++mb;
        }
    }
}